

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_1_pkg_name(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_string(&G->data,PVIP_NODE_IDENT,yytext,(long)yyleng);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_pkg_name(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
  yyprintf((stderr, "do yy_1_pkg_name"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
    yy = PVIP_node_new_string(&(G->data), PVIP_NODE_IDENT, yytext, yyleng);\n\
}\n"));
  
    yy = PVIP_node_new_string(&(G->data), PVIP_NODE_IDENT, yytext, yyleng);
;
}